

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDSimulationDataGenerator.cpp
# Opt level: O3

U32 __thiscall
SWDSimulationDataGenerator::GenerateSimulationData
          (SWDSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U8 req;
  bool is_write;
  uint uVar1;
  U32 UVar2;
  ulong uVar3;
  ulong uVar4;
  SimulationChannelDescriptor *pSVar5;
  uint uVar6;
  
  uVar3 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  if (uVar4 < uVar3) {
    uVar6 = (int)this + 0x18;
    do {
      uVar4 = (ulong)this->mSimulCnt;
      req = simul_data[uVar4].request;
      if (simul_data[uVar4].request == '\0') {
        ClockGenerator::AdvanceByTimeS(0.01);
        SimulationChannelDescriptorGroup::AdvanceAll(uVar6);
        OutputLineReset(this);
        this->mSimulCnt = 0;
        uVar4 = 0;
        req = simul_data[0].request;
      }
      is_write = OutputRequest(this,req,'\x01',simul_data[uVar4].data & BIT_HIGH);
      OutputData(this,simul_data[uVar4].data,is_write);
      uVar1 = this->mSimulCnt + 1;
      this->mSimulCnt = uVar1;
      if (simul_data[uVar1].request == '\0') {
        OutputRequest(this,0xa5,'\x04',BIT_HIGH);
        ClockGenerator::AdvanceByTimeS(9.999999999999999e-06);
        SimulationChannelDescriptorGroup::AdvanceAll(uVar6);
        OutputRequest(this,0xb1,'\x02',BIT_LOW);
        ClockGenerator::AdvanceByTimeS(9.999999999999999e-06);
        SimulationChannelDescriptorGroup::AdvanceAll(uVar6);
      }
      uVar4 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    } while (uVar4 < uVar3);
  }
  pSVar5 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar5;
  UVar2 = SimulationChannelDescriptorGroup::GetCount();
  return UVar2;
}

Assistant:

U32 SWDSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                        SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    // while the caller needs more samples
    while( mSWCLK->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        // if we've reached the end of the array of data
        if( simul_data[ mSimulCnt ].request == 0 )
        {
            // pause, reset and restart the data
            AdvanceAllBySec( 0.01 );
            OutputLineReset();
            mSimulCnt = 0;
        }

        // shortcut to the simulated data object
        const SimulationData& sim( simul_data[ mSimulCnt ] );

        // the request and ACK with turnarounds
        // we need the first data bit to prepare the data line
        bool is_write = OutputRequest( sim.request, ACK_OK, ( sim.data & 1 ) ? BIT_HIGH : BIT_LOW );
        OutputData( sim.data, is_write ); // the WData part with parity

        mSimulCnt++;

        // have we reached the end of the data?
        if( simul_data[ mSimulCnt ].request == 0 )
        {
            // show a fault and wait response
            OutputRequest( 0xA5, ACK_FAULT, BIT_HIGH );
            AdvanceAllBySec( TENTH_US * 100 );
            OutputRequest( 0xB1, ACK_WAIT, BIT_LOW );
            AdvanceAllBySec( TENTH_US * 100 );
        }
    }

    *simulation_channels = mSWDSimulationChannels.GetArray();

    return mSWDSimulationChannels.GetCount();
}